

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsParallel.h
# Opt level: O1

void highs::parallel::for_each<HEkkDual::majorUpdateFtranParallel()::__0&>
               (HighsInt start,HighsInt end,anon_class_24_3_04dd5b7a *f,HighsInt grainSize)

{
  uint32_t *puVar1;
  __atomic_base<int> _Var2;
  double dVar3;
  uint uVar4;
  uint32_t uVar5;
  element_type *peVar6;
  HEkkDual *pHVar7;
  HVector *pHVar8;
  HighsSplitDeque *pHVar9;
  long *plVar10;
  ulong uVar11;
  HighsTimerClock *pHVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  TaskGroup tg;
  TaskGroup local_40;
  
  iVar14 = end - start;
  if (grainSize < iVar14) {
    HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
    plVar10 = (long *)__tls_get_addr(&PTR_00449ef0);
    local_40.workerDeque = (HighsSplitDeque *)*plVar10;
    local_40.dequeHead = ((local_40.workerDeque)->ownerData).head;
    do {
      pHVar9 = local_40.workerDeque;
      iVar14 = start + end >> 1;
      uVar4 = ((local_40.workerDeque)->ownerData).head;
      uVar11 = (ulong)uVar4;
      if (uVar11 < 0x2000) {
        ((local_40.workerDeque)->ownerData).head = uVar4 + 1;
        ((local_40.workerDeque)->taskArray)._M_elems[uVar11].metadata.stealer.
        super___atomic_base<unsigned_long>._M_i = 0;
        *(undefined ***)((local_40.workerDeque)->taskArray)._M_elems[uVar11].taskData =
             &PTR_operator___00449460;
        *(int *)(((local_40.workerDeque)->taskArray)._M_elems[uVar11].taskData + 8) = iVar14;
        *(HighsInt *)(((local_40.workerDeque)->taskArray)._M_elems[uVar11].taskData + 0xc) = end;
        *(HighsInt *)(((local_40.workerDeque)->taskArray)._M_elems[uVar11].taskData + 0x10) =
             grainSize;
        *(anon_class_24_3_04dd5b7a **)
         (((local_40.workerDeque)->taskArray)._M_elems[uVar11].taskData + 0x18) = f;
        if (((local_40.workerDeque)->ownerData).allStolenCopy == true) {
          uVar5 = ((local_40.workerDeque)->ownerData).head;
          ((local_40.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
               CONCAT44(uVar5 - 1,uVar5);
          ((local_40.workerDeque)->stealerData).allStolen._M_base._M_i = false;
          ((local_40.workerDeque)->ownerData).splitCopy = ((local_40.workerDeque)->ownerData).head;
          ((local_40.workerDeque)->ownerData).allStolenCopy = false;
          if ((((local_40.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
            ((local_40.workerDeque)->splitRequest)._M_base._M_i = false;
          }
          peVar6 = ((local_40.workerDeque)->ownerData).workerBunk.
                   super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          LOCK();
          _Var2._M_i = (peVar6->haveJobs).super___atomic_base<int>._M_i;
          (peVar6->haveJobs).super___atomic_base<int>._M_i =
               (peVar6->haveJobs).super___atomic_base<int>._M_i + 1;
          UNLOCK();
          if (_Var2._M_i < ((local_40.workerDeque)->ownerData).numWorkers + -1) {
            HighsSplitDeque::WorkerBunk::publishWork
                      (((local_40.workerDeque)->ownerData).workerBunk.
                       super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,local_40.workerDeque);
          }
        }
        else {
          HighsSplitDeque::growShared(local_40.workerDeque);
        }
      }
      else {
        if ((((local_40.workerDeque)->ownerData).splitCopy < 0x2000) &&
           (((local_40.workerDeque)->ownerData).allStolenCopy == false)) {
          HighsSplitDeque::growShared(local_40.workerDeque);
        }
        puVar1 = &(pHVar9->ownerData).head;
        *puVar1 = *puVar1 + 1;
        for_each<HEkkDual::majorUpdateFtranParallel()::__0&>(iVar14,end,f,grainSize);
      }
      end = iVar14;
    } while (grainSize < iVar14 - start);
    iVar13 = iVar14 - start;
    if (iVar13 != 0 && start <= iVar14) {
      pHVar7 = f->this;
      lVar15 = (long)start;
      do {
        pHVar8 = (*f->multi_vector)[lVar15];
        dVar3 = (*f->multi_density)[lVar15];
        pHVar12 = HighsSimplexAnalysis::getThreadFactorTimerClockPointer(pHVar7->analysis);
        HSimplexNla::ftran(&pHVar7->ekk_instance_->simplex_nla_,pHVar8,dVar3,pHVar12);
        lVar15 = lVar15 + 1;
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
    }
    TaskGroup::taskWait(&local_40);
    TaskGroup::~TaskGroup(&local_40);
  }
  else if (start < end) {
    pHVar7 = f->this;
    lVar15 = (long)start;
    do {
      pHVar8 = (*f->multi_vector)[lVar15];
      dVar3 = (*f->multi_density)[lVar15];
      pHVar12 = HighsSimplexAnalysis::getThreadFactorTimerClockPointer(pHVar7->analysis);
      HSimplexNla::ftran(&pHVar7->ekk_instance_->simplex_nla_,pHVar8,dVar3,pHVar12);
      lVar15 = lVar15 + 1;
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
  }
  return;
}

Assistant:

void for_each(HighsInt start, HighsInt end, F&& f, HighsInt grainSize = 1) {
  if (end - start <= grainSize) {
    f(start, end);
  } else {
    TaskGroup tg;

    do {
      HighsInt split = (start + end) >> 1;
      tg.spawn([split, end, grainSize, &f]() {
        for_each(split, end, f, grainSize);
      });
      end = split;
    } while (end - start > grainSize);

    f(start, end);
    tg.taskWait();
  }
}